

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_lexer.c
# Opt level: O2

gtoken_t gravity_lexer_peek(gravity_lexer_t *lexer)

{
  gtoken_t gVar1;
  long lVar2;
  long lVar3;
  gravity_lexer_t *pgVar4;
  gravity_lexer_t *pgVar5;
  byte bVar6;
  gravity_lexer_t saved;
  
  bVar6 = 0;
  gVar1 = lexer->cache;
  if (gVar1 == TOK_END) {
    lexer->peeking = true;
    lVar3 = 0xc;
    pgVar4 = lexer;
    pgVar5 = &saved;
    for (lVar2 = lVar3; lVar2 != 0; lVar2 = lVar2 + -1) {
      pgVar5->buffer = pgVar4->buffer;
      pgVar4 = (gravity_lexer_t *)&pgVar4->offset;
      pgVar5 = (gravity_lexer_t *)((long)pgVar5 + 8);
    }
    gVar1 = gravity_lexer_next(lexer);
    pgVar4 = &saved;
    pgVar5 = lexer;
    for (; lVar3 != 0; lVar3 = lVar3 + -1) {
      pgVar5->buffer = pgVar4->buffer;
      pgVar4 = (gravity_lexer_t *)((long)pgVar4 + ((ulong)bVar6 * -2 + 1) * 8);
      pgVar5 = (gravity_lexer_t *)((long)pgVar5 + (ulong)bVar6 * -0x10 + 8);
    }
    lexer->peeking = false;
    lexer->cache = gVar1;
  }
  return gVar1;
}

Assistant:

gtoken_t gravity_lexer_peek (gravity_lexer_t *lexer) {
    if (lexer->cache != TOK_END) return lexer->cache;
    
    lexer->peeking = true;
    gravity_lexer_t saved = *lexer;

    gtoken_t result = gravity_lexer_next(lexer);

    *lexer = saved;
    lexer->peeking = false;

    lexer->cache = result;
    return result;
}